

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O3

void __thiscall
OpenMD::SectionParserManager::parse(SectionParserManager *this,istream *input,ForceField *ff)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _List_iterator<OpenMD::SectionParserContext> __last;
  ForceField *ff_00;
  _Elt_pointer pbVar3;
  int iVar4;
  _List_node_base *p_Var5;
  long *plVar6;
  size_t sVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  _Elt_pointer pbVar9;
  _List_iterator<OpenMD::SectionParserContext> _Var10;
  char *__format;
  ulong uVar11;
  _Elt_pointer pbVar12;
  undefined1 auVar13 [16];
  string section;
  string keyword;
  string line;
  StringTokenizer tokenizer;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sectionNameStack;
  char buffer [65535];
  uint uStack_10194;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_10190;
  ulong uStack_10188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_10180;
  string sStack_10170;
  _List_iterator<OpenMD::SectionParserContext> _Stack_10150;
  string sStack_10148;
  string sStack_10128;
  long *aplStack_10108 [2];
  long alStack_100f8 [2];
  ForceField *pFStack_100e8;
  StringTokenizer SStack_100e0;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_10088;
  char acStack_10038 [65544];
  
  _Stack_10150._M_node = (_List_node_base *)&this->sectionParsers_;
  for (p_Var5 = (this->sectionParsers_).
                super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var5 != _Stack_10150._M_node;
      p_Var5 = p_Var5->_M_next) {
    *(undefined1 *)&p_Var5[3]._M_prev = 0;
  }
  _Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  _Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_10088._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_10088._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_10088._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  _Stack_10088._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_10088._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Stack_10088._M_impl.super__Deque_impl_data._M_map_size = 0;
  pFStack_100e8 = ff;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&_Stack_10088,0);
  paVar1 = &SStack_100e0.tokenString_.field_2;
  uStack_10194 = 1;
  do {
    std::ios::widen((char)input->_vptr_basic_istream[-3] + (char)input);
    plVar6 = (long *)std::istream::getline((char *)input,(long)acStack_10038,-1);
    if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
      if (_Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          _Stack_10088._M_impl.super__Deque_impl_data._M_start._M_cur) {
        memcpy(&painCave,
               "SectionParserManager Error: Stack is not empty.\n\tCheck for matching begin / end lines.\n"
               ,0x58);
        painCave.isFatal = 1;
        simError();
      }
      ff_00 = pFStack_100e8;
      _Var10._M_node = _Stack_10150._M_node;
      for (p_Var5 = (_Stack_10150._M_node)->_M_next; p_Var5 != _Var10._M_node;
          p_Var5 = p_Var5->_M_next) {
        if (*(char *)&p_Var5[3]._M_prev == '\x01') {
          std::ios::clear((int)input->_vptr_basic_istream[-3] + (int)input);
          std::istream::seekg(input,p_Var5[2]._M_prev,p_Var5[3]._M_next);
          SectionParser::parse
                    ((SectionParser *)p_Var5[1]._M_prev,input,ff_00,*(int *)&p_Var5[2]._M_next);
          (*(code *)(p_Var5[1]._M_prev)->_M_next[1]._M_next)(p_Var5[1]._M_prev,ff_00);
        }
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&_Stack_10088);
      return;
    }
    paStack_10190 = &aStack_10180;
    sVar7 = strlen(acStack_10038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&paStack_10190,acStack_10038,acStack_10038 + sVar7);
    std::locale::locale((locale *)&sStack_10148);
    paVar2 = paStack_10190;
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<OpenMD::Utils::trimLeft(std::__cxx11::string&,std::locale_const&)::_lambda(auto:1)_1_>>
                      (paStack_10190,paStack_10190->_M_local_buf + uStack_10188,&sStack_10148);
    uVar11 = (long)paVar2 - (long)paStack_10190;
    if (paStack_10190->_M_local_buf + uStack_10188 == _Var8._M_current) {
      paStack_10190->_M_local_buf[uVar11] = '\0';
      uStack_10188 = uVar11;
    }
    else {
      std::__cxx11::string::_M_erase((ulong)&paStack_10190,uVar11);
    }
    if (paStack_10190 == &aStack_10180) {
      SStack_100e0.tokenString_.field_2._8_8_ = aStack_10180._8_8_;
      SStack_100e0.tokenString_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      SStack_100e0.tokenString_._M_dataplus._M_p = (pointer)paStack_10190;
    }
    SStack_100e0.tokenString_.field_2._M_allocated_capacity._1_7_ =
         aStack_10180._M_allocated_capacity._1_7_;
    SStack_100e0.tokenString_.field_2._M_local_buf[0] = aStack_10180._M_local_buf[0];
    SStack_100e0.tokenString_._M_string_length = uStack_10188;
    uStack_10188 = 0;
    aStack_10180._M_local_buf[0] = '\0';
    paStack_10190 = &aStack_10180;
    stripComments(&sStack_10128,&SStack_100e0.tokenString_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)SStack_100e0.tokenString_._M_dataplus._M_p != paVar1) {
      operator_delete(SStack_100e0.tokenString_._M_dataplus._M_p,
                      SStack_100e0.tokenString_.field_2._M_allocated_capacity + 1);
    }
    std::locale::~locale((locale *)&sStack_10148);
    if (paStack_10190 != &aStack_10180) {
      operator_delete(paStack_10190,
                      CONCAT71(aStack_10180._M_allocated_capacity._1_7_,aStack_10180._M_local_buf[0]
                              ) + 1);
    }
    if ((sStack_10128._M_string_length != 0) &&
       (((sStack_10128._M_string_length == 1 || (*sStack_10128._M_dataplus._M_p != '/')) ||
        (sStack_10128._M_dataplus._M_p[1] != '/')))) {
      sStack_10148._M_dataplus._M_p = (pointer)&sStack_10148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10148," ;\t\n\r","");
      StringTokenizer::StringTokenizer(&SStack_100e0,&sStack_10128,&sStack_10148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_10148._M_dataplus._M_p != &sStack_10148.field_2) {
        operator_delete(sStack_10148._M_dataplus._M_p,sStack_10148.field_2._M_allocated_capacity + 1
                       );
      }
      iVar4 = StringTokenizer::countTokens(&SStack_100e0);
      if (1 < iVar4) {
        StringTokenizer::nextToken_abi_cxx11_(&sStack_10148,&SStack_100e0);
        iVar4 = std::__cxx11::string::compare((char *)&sStack_10148);
        if (iVar4 == 0) {
          StringTokenizer::nextToken_abi_cxx11_(&sStack_10170,&SStack_100e0);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&_Stack_10088,&sStack_10170);
          __last._M_node = _Stack_10150._M_node;
          _Var10._M_node = (_Stack_10150._M_node)->_M_next;
          aplStack_10108[0] = alStack_100f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)aplStack_10108,sStack_10170._M_dataplus._M_p,
                     sStack_10170._M_dataplus._M_p + sStack_10170._M_string_length);
          _Var10 = std::
                   find_if<std::_List_iterator<OpenMD::SectionParserContext>,OpenMD::SameSectionParserFunctor>
                             (_Var10,__last,(SameSectionParserFunctor *)aplStack_10108);
          if (aplStack_10108[0] != alStack_100f8) {
            operator_delete(aplStack_10108[0],alStack_100f8[0] + 1);
          }
          if (_Var10._M_node == _Stack_10150._M_node) {
            __format = 
            "SectionParserManager Error: Can not find corresponding section parser for %s\n";
LAB_001fc225:
            snprintf(painCave.errMsg,2000,__format,sStack_10170._M_dataplus._M_p);
            painCave.isFatal = 1;
            simError();
          }
          else {
            if (*(char *)&_Var10._M_node[3]._M_prev == '\x01') {
              __format = "SectionParserManager Error: Found multiple %s sections\n";
              goto LAB_001fc225;
            }
            *(undefined1 *)&_Var10._M_node[3]._M_prev = 1;
            *(uint *)&_Var10._M_node[2]._M_next = uStack_10194;
            auVar13 = std::istream::tellg();
            *(undefined1 (*) [16])&_Var10._M_node[2]._M_prev = auVar13;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_10170._M_dataplus._M_p != &sStack_10170.field_2) {
LAB_001fc275:
            operator_delete(sStack_10170._M_dataplus._M_p,
                            sStack_10170.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&sStack_10148);
          if (iVar4 == 0) {
            StringTokenizer::nextToken_abi_cxx11_(&sStack_10170,&SStack_100e0);
            pbVar3 = _Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_first;
            pbVar12 = _Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_cur;
            pbVar9 = _Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (_Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                _Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_first) {
              pbVar9 = _Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
            }
            sVar7 = pbVar9[-1]._M_string_length;
            if ((sVar7 == sStack_10170._M_string_length) &&
               ((sVar7 == 0 ||
                (iVar4 = bcmp(pbVar9[-1]._M_dataplus._M_p,sStack_10170._M_dataplus._M_p,sVar7),
                iVar4 == 0)))) {
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&_Stack_10088);
            }
            else {
              if (pbVar12 == pbVar3) {
                pbVar12 = _Stack_10088._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
              }
              snprintf(painCave.errMsg,2000,
                       "SectionParserManager Error: begin %s and end %s do not match at line %d\n",
                       pbVar12[-1]._M_dataplus._M_p,sStack_10170._M_dataplus._M_p,
                       (ulong)uStack_10194);
              painCave.isFatal = 1;
              simError();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_10170._M_dataplus._M_p != &sStack_10170.field_2) goto LAB_001fc275;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_10148._M_dataplus._M_p != &sStack_10148.field_2) {
          operator_delete(sStack_10148._M_dataplus._M_p,
                          sStack_10148.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_100e0.delim_._M_dataplus._M_p != &SStack_100e0.delim_.field_2) {
        operator_delete(SStack_100e0.delim_._M_dataplus._M_p,
                        SStack_100e0.delim_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_100e0.tokenString_._M_dataplus._M_p != paVar1) {
        operator_delete(SStack_100e0.tokenString_._M_dataplus._M_p,
                        SStack_100e0.tokenString_.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_10128._M_dataplus._M_p != &sStack_10128.field_2) {
      operator_delete(sStack_10128._M_dataplus._M_p,sStack_10128.field_2._M_allocated_capacity + 1);
    }
    uStack_10194 = uStack_10194 + 1;
  } while( true );
}

Assistant:

void SectionParserManager::parse(std::istream& input, ForceField& ff) {
    // reset active flags
    SectionParserManager::iterator i;
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      i->isActive = false;
    }

    const int bufferSize = 65535;
    char buffer[bufferSize];
    int lineNo = 0;
    std::stack<std::string> sectionNameStack;
    // scan through the input stream and find section names
    while (input.getline(buffer, bufferSize)) {
      ++lineNo;

      std::string line = stripComments(Utils::trimLeftCopy(buffer));
      // a line begins with "//" is a comment line
      if (line.empty() ||
          (line.size() >= 2 && line[0] == '/' && line[1] == '/')) {
        continue;
      } else {
        StringTokenizer tokenizer(line);
        if (tokenizer.countTokens() < 2) {
          continue;
        } else {
          std::string keyword = tokenizer.nextToken();

          if (keyword == "begin") {
            std::string section = tokenizer.nextToken();
            sectionNameStack.push(section);

            i = std::find_if(sectionParsers_.begin(), sectionParsers_.end(),
                             SameSectionParserFunctor(section));
            if (i == sectionParsers_.end()) {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "SectionParserManager Error: Can not find corresponding "
                       "section parser for %s\n",
                       section.c_str());
              painCave.isFatal = 1;
              simError();
            } else {
              if (i->isActive) {
                snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                         "SectionParserManager Error: Found multiple %s "
                         "sections\n",
                         section.c_str());
                painCave.isFatal = 1;
                simError();
              } else {
                i->isActive = true;
                i->lineNo   = lineNo;
                i->offset   = input.tellg();
              }
            }
          } else if (keyword == "end") {
            std::string section = tokenizer.nextToken();
            if (sectionNameStack.top() == section) {
              sectionNameStack.pop();
            } else {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "SectionParserManager Error: begin %s "
                       "and end %s do not match at line %d\n",
                       sectionNameStack.top().c_str(), section.c_str(), lineNo);
              painCave.isFatal = 1;
              simError();
            }
          } else {
            continue;
          }
        }
      }
    }

    if (!sectionNameStack.empty()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SectionParserManager Error: Stack is not empty.\n"
               "\tCheck for matching begin / end lines.\n");
      painCave.isFatal = 1;
      simError();
    }

    // invoke parser
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      if (i->isActive) {
        // C++ standard does not guarantee seekg resets EOF, in that
        // case, seekg will fail. It is always a good idea to call
        // clear() before seek
        input.clear();
        input.seekg(i->offset);
        (i->sectionParser)->parse(input, ff, i->lineNo);
        (i->sectionParser)->validateSection(ff);
      }
    }
  }